

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt_hc::compress
          (dxt_hc *this,color_quad_u8 (*blocks) [16],
          vector<crnlib::dxt_hc::endpoint_indices_details> *endpoint_indices,
          vector<crnlib::dxt_hc::selector_indices_details> *selector_indices,
          vector<unsigned_int> *color_endpoints,vector<unsigned_int> *alpha_endpoints,
          vector<unsigned_int> *color_selectors,vector<unsigned_long_long> *alpha_selectors,
          params *p)

{
  undefined8 *puVar1;
  float fVar2;
  uint16 uVar3;
  dxt_format dVar4;
  uint uVar5;
  tile_details *ptVar6;
  void *p_00;
  float *pfVar7;
  color_cluster *pcVar8;
  alpha_cluster *paVar9;
  uint *puVar10;
  unsigned_long_long *puVar11;
  vector<unsigned_int> *this_00;
  vector<crnlib::dxt_hc::selector_indices_details> *this_01;
  uint8 uVar12;
  uint i;
  uint uVar13;
  uint uVar14;
  crn_thread_id_t cVar15;
  long lVar16;
  executable_task *pObj;
  int iVar17;
  float (*pafVar18) [8];
  task_pool *this_02;
  bool bVar19;
  uint uVar20;
  elemental_vector *peVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint b;
  code *pcVar25;
  uint uVar26;
  ulong uVar27;
  uint64 data;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  float fVar31;
  float fVar32;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  alpha_selectors_map;
  vector<unsigned_short> alpha_selectors_remap;
  vector<unsigned_short> color_selectors_remap;
  vector<unsigned_short> alpha_endpoints_remap;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_selectors_map;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  alpha_endpoints_map;
  vector<unsigned_short> color_endpoints_remap;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_endpoints_map;
  insert_result insert_result_3;
  undefined1 local_168 [16];
  uint local_158;
  undefined8 local_150;
  elemental_vector local_148;
  elemental_vector local_138;
  elemental_vector local_128;
  vector<unsigned_int> *local_118;
  vector<crnlib::dxt_hc::endpoint_indices_details> *local_110;
  undefined1 local_108 [16];
  uint local_f8;
  undefined8 local_f0;
  uint local_e0;
  uint local_dc;
  undefined1 local_d8 [16];
  uint local_c8;
  undefined8 local_c0;
  elemental_vector local_b8;
  anon_struct_16_4_e4b8e16b *local_a0;
  ulong local_98;
  vector<crnlib::dxt_hc::selector_indices_details> *local_90;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  local_88;
  insert_result local_60;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  clear(this);
  dVar4 = p->m_format;
  uVar26 = dVar4 + ~cDXN_YX;
  this->m_has_etc_color_blocks = uVar26 < 5;
  this->m_has_subblocks = uVar26 < 3;
  bVar19 = true;
  if ((dVar4 != cDXT1) && (dVar4 != cDXT5)) {
    bVar19 = uVar26 < 5;
  }
  this->m_has_color_blocks = bVar19;
  uVar26 = dVar4 + ~cDXT3;
  if ((uVar26 < 9) && ((0x147U >> (uVar26 & 0x1f) & 1) != 0)) {
    uVar14 = *(uint *)(&DAT_001ac250 + (ulong)uVar26 * 4);
  }
  else {
    uVar14 = (uint)(dVar4 == cDXN_YX) * 2;
  }
  this->m_num_alpha_blocks = uVar14;
  bVar19 = (bool)(uVar14 != 0 | bVar19);
  if (bVar19 == true) {
    this->m_blocks = blocks;
    local_118 = alpha_endpoints;
    local_90 = selector_indices;
    cVar15 = crn_get_current_thread_id();
    this->m_main_thread_id = cVar15;
    this->m_pTask_pool = p->m_pTask_pool;
    memcpy(&this->m_params,p,0x158);
    if (p->m_num_levels != 0) {
      pafVar18 = this->m_color_derating;
      uVar27 = 0;
      do {
        fVar2 = p->m_adaptive_tile_color_psnr_derating;
        fVar32 = fVar2;
        if ((uVar27 != 0) && (0.25 < fVar2)) {
          fVar31 = powf(3.0,(float)(uVar27 & 0xffffffff));
          fVar32 = 0.25;
          if (0.25 <= fVar2 / fVar31) {
            fVar32 = fVar2 / fVar31;
          }
        }
        lVar16 = 0;
        do {
          *(float *)((long)*pafVar18 + lVar16) =
               ((float)*(uint *)((long)&DAT_001ac150 + lVar16) / 3.0) * fVar32 + 0.0;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0x20);
        uVar27 = uVar27 + 1;
        pafVar18 = pafVar18 + 1;
      } while (uVar27 < p->m_num_levels);
    }
    lVar16 = 0;
    do {
      *(float *)((long)this->m_alpha_derating + lVar16) =
           ((float)*(uint *)((long)&DAT_001ac150 + lVar16) / 3.0) *
           (this->m_params).m_adaptive_tile_alpha_psnr_derating + 0.0;
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x20);
    lVar16 = 0;
    do {
      this->m_uint8_to_float[lVar16] = (float)(int)lVar16 / 255.0;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x100);
    uVar26 = (this->m_block_weights).m_size;
    uVar5 = (this->m_params).m_num_blocks;
    this->m_num_blocks = uVar5;
    if (uVar26 != uVar5) {
      if (uVar26 <= uVar5) {
        if ((this->m_block_weights).m_capacity < uVar5) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_block_weights,uVar5,uVar26 + 1 == uVar5,4,
                     (object_mover)0x0,false);
        }
        uVar26 = (this->m_block_weights).m_size;
        memset((this->m_block_weights).m_p + uVar26,0,(ulong)(uVar5 - uVar26) << 2);
      }
      (this->m_block_weights).m_size = uVar5;
    }
    uVar26 = this->m_num_blocks;
    uVar5 = (this->m_block_encodings).m_size;
    if (uVar5 != uVar26) {
      if (uVar5 <= uVar26) {
        if ((this->m_block_encodings).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_block_encodings,uVar26,uVar5 + 1 == uVar26,1,
                     (object_mover)0x0,false);
        }
        uVar5 = (this->m_block_encodings).m_size;
        memset((this->m_block_encodings).m_p + uVar5,0,(ulong)(uVar26 - uVar5));
      }
      (this->m_block_encodings).m_size = uVar26;
    }
    lVar16 = 0x668;
    do {
      peVar21 = (elemental_vector *)((long)(this->m_color_derating + -1) + 0xc + lVar16);
      uVar26 = this->m_num_blocks;
      uVar5 = *(uint *)((long)(this->m_color_derating + -1) + 0x14 + lVar16);
      if (uVar5 != uVar26) {
        if (uVar5 <= uVar26) {
          if (*(uint *)((long)(this->m_color_derating + -1) + 0x18 + lVar16) < uVar26) {
            elemental_vector::increase_capacity
                      (peVar21,uVar26,uVar5 + 1 == uVar26,8,(object_mover)0x0,false);
          }
          memset((void *)((ulong)peVar21->m_size * 8 + (long)peVar21->m_p),0,
                 (ulong)(uVar26 - peVar21->m_size) << 3);
        }
        peVar21->m_size = uVar26;
      }
      lVar16 = lVar16 + 0x10;
    } while (lVar16 != 0x698);
    uVar26 = this->m_num_blocks;
    uVar5 = (this->m_tile_indices).m_size;
    if (uVar5 != uVar26) {
      if (uVar5 <= uVar26) {
        if ((this->m_tile_indices).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_tile_indices,uVar26,uVar5 + 1 == uVar26,4,
                     (object_mover)0x0,false);
        }
        uVar5 = (this->m_tile_indices).m_size;
        memset((this->m_tile_indices).m_p + uVar5,0,(ulong)(uVar26 - uVar5) << 2);
      }
      (this->m_tile_indices).m_size = uVar26;
    }
    local_110 = &this->m_endpoint_indices;
    uVar26 = this->m_num_blocks;
    uVar5 = (this->m_endpoint_indices).m_size;
    if (uVar5 != uVar26) {
      if (uVar5 <= uVar26) {
        if ((this->m_endpoint_indices).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)local_110,uVar26,uVar5 + 1 == uVar26,8,
                     vector<crnlib::dxt_hc::endpoint_indices_details>::object_mover,false);
        }
        uVar5 = (this->m_endpoint_indices).m_size;
        if (uVar26 != uVar5) {
          memset(local_110->m_p + uVar5,0,(ulong)(uVar26 - uVar5) << 3);
        }
      }
      (this->m_endpoint_indices).m_size = uVar26;
    }
    uVar26 = this->m_num_blocks;
    uVar5 = (this->m_selector_indices).m_size;
    if (uVar5 != uVar26) {
      if (uVar5 <= uVar26) {
        if ((this->m_selector_indices).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_selector_indices,uVar26,uVar5 + 1 == uVar26,6,
                     vector<crnlib::dxt_hc::selector_indices_details>::object_mover,false);
        }
        uVar5 = (this->m_selector_indices).m_size;
        if (uVar26 != uVar5) {
          memset((this->m_selector_indices).m_p + uVar5,0,
                 (((ulong)(uVar26 - uVar5) * 6 - 6) / 6) * 6 + 6);
        }
      }
      (this->m_selector_indices).m_size = uVar26;
    }
    uVar26 = this->m_num_blocks;
    uVar5 = (this->m_tiles).m_size;
    uVar13 = uVar5 - uVar26;
    if (uVar13 != 0) {
      if (uVar5 < uVar26 || uVar13 == 0) {
        if ((this->m_tiles).m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this,uVar26,uVar5 + 1 == uVar26,0x48,
                     vector<crnlib::dxt_hc::tile_details>::object_mover,false);
        }
        uVar5 = (this->m_tiles).m_size;
        uVar13 = uVar26 - uVar5;
        if (uVar13 != 0) {
          ptVar6 = (this->m_tiles).m_p;
          lVar16 = 0;
          do {
            puVar1 = (undefined8 *)((long)ptVar6[uVar5].color_endpoint.m_s + lVar16 + -0x14);
            *puVar1 = 0;
            puVar1[1] = 0;
            lVar16 = lVar16 + 0x48;
          } while ((ulong)uVar13 * 0x48 != lVar16);
        }
      }
      else {
        ptVar6 = (this->m_tiles).m_p;
        lVar16 = 0;
        do {
          p_00 = *(void **)((long)ptVar6[uVar26].color_endpoint.m_s + lVar16 + -0x14);
          if (p_00 != (void *)0x0) {
            crnlib_free(p_00);
          }
          lVar16 = lVar16 + 0x48;
        } while ((ulong)uVar13 * 0x48 != lVar16);
      }
      (this->m_tiles).m_size = uVar26;
    }
    uVar26 = p->m_num_levels;
    if ((ulong)uVar26 != 0) {
      pfVar7 = (this->m_block_weights).m_p;
      uVar27 = 0;
      do {
        uVar5 = p->m_levels[uVar27].m_first_block;
        uVar23 = (ulong)uVar5;
        uVar13 = p->m_levels[uVar27].m_num_blocks + uVar5;
        if (uVar5 < uVar13) {
          fVar2 = p->m_levels[uVar27].m_weight;
          do {
            pfVar7[uVar23] = fVar2;
            uVar23 = uVar23 + 1;
          } while (uVar13 != uVar23);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar26);
    }
    this_02 = this->m_pTask_pool;
    data = 0;
    do {
      pcVar25 = determine_tiles_task;
      if (this->m_has_subblocks != false) {
        pcVar25 = determine_tiles_task_etc;
      }
      pObj = (executable_task *)crnlib_malloc(0x28);
      pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001ce9c0;
      pObj[1]._vptr_executable_task = (_func_int **)this;
      pObj[2]._vptr_executable_task = (_func_int **)pcVar25;
      pObj[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
      task_pool::queue_task(this_02,pObj,data,(void *)0x0);
      uVar26 = (int)data + 1;
      data = (uint64)uVar26;
      this_02 = this->m_pTask_pool;
    } while (uVar26 <= this_02->m_num_threads);
    task_pool::join(this_02);
    this_00 = local_118;
    this->m_num_tiles = 0;
    uVar27 = (ulong)(this->m_tiles).m_size;
    if (uVar27 != 0) {
      uVar14 = this->m_num_tiles;
      ptVar6 = (this->m_tiles).m_p;
      lVar16 = 0;
      do {
        if (*(int *)((long)(ptVar6->color_endpoint).m_s + lVar16 + -0xc) != 0) {
          uVar14 = uVar14 + 1;
          this->m_num_tiles = uVar14;
        }
        lVar16 = lVar16 + 0x48;
      } while (uVar27 * 0x48 != lVar16);
    }
    if (this->m_has_color_blocks != false) {
      determine_color_endpoints(this);
    }
    if (this->m_num_alpha_blocks != 0) {
      determine_alpha_endpoints(this);
    }
    if (this->m_has_color_blocks == true) {
      create_color_selector_codebook(this);
    }
    if (this->m_num_alpha_blocks != 0) {
      create_alpha_selector_codebook(this);
    }
    vector<unsigned_int>::reserve
              (color_endpoints,(this->m_color_clusters).m_size + color_endpoints->m_size);
    uVar14 = (this->m_color_clusters).m_size;
    local_b8.m_p = (void *)0x0;
    local_b8.m_size = 0;
    local_b8.m_capacity = 0;
    if (uVar14 != 0) {
      elemental_vector::increase_capacity(&local_b8,uVar14,uVar14 == 1,2,(object_mover)0x0,false);
      memset((void *)((local_b8._8_8_ & 0xffffffff) * 2 + (long)local_b8.m_p),0,
             (ulong)(uVar14 - local_b8.m_size) * 2);
      local_b8.m_size = uVar14;
    }
    local_88.m_values.m_p = (raw_node *)0x0;
    local_88.m_values.m_size = 0;
    local_88.m_values.m_capacity = 0;
    local_88.m_hash_shift = 0x20;
    local_88.m_num_valid = 0;
    local_88.m_grow_threshold = 0;
    if ((this->m_color_clusters).m_size != 0) {
      lVar16 = 0x22;
      uVar27 = 0;
      do {
        pcVar8 = (this->m_color_clusters).m_p;
        if (*(int *)((long)pcVar8->blocks + lVar16 * 2 + -0xc) != 0) {
          uVar14 = *(uint *)((long)pcVar8->blocks + lVar16 * 2 + -4);
          if (this->m_has_etc_color_blocks == false) {
            uVar14 = dxt1_block::pack_endpoints
                               (uVar14,*(uint *)((long)&pcVar8->blocks[0].m_p + lVar16 * 2));
          }
          local_108._0_4_ = uVar14;
          local_168._0_4_ = color_endpoints->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_d8,&local_88,(uint *)local_108,(uint *)local_168);
          if (local_c8._0_1_ == true) {
            uVar26 = color_endpoints->m_size;
            *(short *)((long)local_b8.m_p + uVar27 * 2) = (short)uVar26;
            if (color_endpoints->m_capacity <= uVar26) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)color_endpoints,uVar26 + 1,true,4,(object_mover)0x0,
                         false);
            }
            color_endpoints->m_p[color_endpoints->m_size] = local_108._0_4_;
            color_endpoints->m_size = color_endpoints->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_b8.m_p + uVar27 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_d8._0_8_)->m_p[local_d8._8_8_ & 0xffffffff].m_bits + 4);
          }
        }
        uVar27 = uVar27 + 1;
        lVar16 = lVar16 + 0x2c;
      } while (uVar27 < (this->m_color_clusters).m_size);
    }
    vector<unsigned_int>::reserve(this_00,(this->m_alpha_clusters).m_size + this_00->m_size);
    uVar14 = (this->m_alpha_clusters).m_size;
    local_128.m_p = (void *)0x0;
    local_128.m_size = 0;
    local_128.m_capacity = 0;
    if (uVar14 != 0) {
      elemental_vector::increase_capacity(&local_128,uVar14,uVar14 == 1,2,(object_mover)0x0,false);
      memset((void *)((local_128._8_8_ & 0xffffffff) * 2 + (long)local_128.m_p),0,
             (ulong)(uVar14 - local_128.m_size) * 2);
      local_128.m_size = uVar14;
    }
    local_d8._0_8_ = (hash_map_type *)0x0;
    local_d8._8_4_ = 0;
    local_d8._12_4_ = 0;
    local_c8 = 0x20;
    local_c0._0_4_ = 0;
    local_c0._4_4_ = 0;
    if ((this->m_alpha_clusters).m_size != 0) {
      lVar16 = 0x22;
      uVar27 = 0;
      do {
        paVar9 = (this->m_alpha_clusters).m_p;
        if (*(int *)((long)paVar9->blocks + lVar16 * 2 + -0xc) != 0) {
          uVar14 = dxt5_block::pack_endpoints
                             (*(uint *)((long)paVar9->blocks + lVar16 * 2 + -4),
                              *(uint *)((long)&paVar9->blocks[0].m_p + lVar16 * 2));
          local_168._0_4_ = uVar14;
          local_60.first.m_pTable._0_4_ = this_00->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_108,
                   (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    *)local_d8,(uint *)local_168,(uint *)&local_60);
          if (local_f8._0_1_ == true) {
            uVar26 = this_00->m_size;
            *(short *)((long)local_128.m_p + uVar27 * 2) = (short)uVar26;
            if (this_00->m_capacity <= uVar26) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_00,uVar26 + 1,true,4,(object_mover)0x0,false);
            }
            this_00->m_p[this_00->m_size] = local_168._0_4_;
            this_00->m_size = this_00->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_128.m_p + uVar27 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_108._0_8_)->m_p[local_108._8_8_ & 0xffffffff].m_bits + 4);
          }
        }
        uVar27 = uVar27 + 1;
        lVar16 = lVar16 + 0x48;
      } while (uVar27 < (this->m_alpha_clusters).m_size);
    }
    vector<unsigned_int>::reserve
              (color_selectors,(this->m_color_selectors).m_size + color_selectors->m_size);
    uVar14 = (this->m_color_selectors).m_size;
    local_138.m_p = (void *)0x0;
    local_138.m_size = 0;
    local_138.m_capacity = 0;
    if (uVar14 != 0) {
      elemental_vector::increase_capacity(&local_138,uVar14,uVar14 == 1,2,(object_mover)0x0,false);
      memset((void *)((local_138._8_8_ & 0xffffffff) * 2 + (long)local_138.m_p),0,
             (ulong)(uVar14 - local_138.m_size) * 2);
      local_138.m_size = uVar14;
    }
    local_108._0_8_ = (hash_map_type *)0x0;
    local_108._8_4_ = 0;
    local_108._12_4_ = 0;
    local_f8 = 0x20;
    local_f0._0_4_ = 0;
    local_f0._4_4_ = 0;
    if ((this->m_color_selectors).m_size != 0) {
      uVar27 = 0;
      do {
        if ((this->m_color_selectors_used).m_p[uVar27] == true) {
          local_60.first.m_pTable._0_4_ = color_selectors->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_168,
                   (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    *)local_108,(this->m_color_selectors).m_p + uVar27,(uint *)&local_60);
          if (local_158._0_1_ == true) {
            uVar26 = color_selectors->m_size;
            *(short *)((long)local_138.m_p + uVar27 * 2) = (short)uVar26;
            puVar10 = (this->m_color_selectors).m_p;
            if (color_selectors->m_capacity <= uVar26) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)color_selectors,uVar26 + 1,true,4,(object_mover)0x0,
                         false);
            }
            color_selectors->m_p[color_selectors->m_size] = puVar10[uVar27];
            color_selectors->m_size = color_selectors->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_138.m_p + uVar27 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_168._0_8_)->m_p[local_168._8_8_ & 0xffffffff].m_bits + 4);
          }
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 < (this->m_color_selectors).m_size);
    }
    vector<unsigned_long_long>::reserve
              (alpha_selectors,(this->m_alpha_selectors).m_size + alpha_selectors->m_size);
    uVar14 = (this->m_alpha_selectors).m_size;
    local_148.m_p = (void *)0x0;
    local_148.m_size = 0;
    local_148.m_capacity = 0;
    if (uVar14 != 0) {
      elemental_vector::increase_capacity(&local_148,uVar14,uVar14 == 1,2,(object_mover)0x0,false);
      memset((void *)((local_148._8_8_ & 0xffffffff) * 2 + (long)local_148.m_p),0,
             (ulong)(uVar14 - local_148.m_size) * 2);
      local_148.m_size = uVar14;
    }
    local_168._0_8_ = (hash_map_type *)0x0;
    local_168._8_4_ = 0;
    local_168._12_4_ = 0;
    local_158 = 0x20;
    local_150._0_4_ = 0;
    local_150._4_4_ = 0;
    if ((this->m_alpha_selectors).m_size != 0) {
      uVar27 = 0;
      do {
        if ((this->m_alpha_selectors_used).m_p[uVar27] == true) {
          local_dc = alpha_selectors->m_size;
          hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
          ::insert(&local_60,
                   (hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                    *)local_168,(this->m_alpha_selectors).m_p + uVar27,&local_dc);
          if (local_60.second == true) {
            uVar26 = alpha_selectors->m_size;
            *(short *)((long)local_148.m_p + uVar27 * 2) = (short)uVar26;
            puVar11 = (this->m_alpha_selectors).m_p;
            if (alpha_selectors->m_capacity <= uVar26) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)alpha_selectors,uVar26 + 1,true,8,(object_mover)0x0,
                         false);
            }
            alpha_selectors->m_p[alpha_selectors->m_size] = puVar11[uVar27];
            alpha_selectors->m_size = alpha_selectors->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_148.m_p + uVar27 * 2) =
                 *(undefined2 *)
                  (*(long *)CONCAT44(local_60.first.m_pTable._4_4_,(uint)local_60.first.m_pTable) +
                   8 + (ulong)local_60.first.m_index * 0x10);
          }
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 < (this->m_alpha_selectors).m_size);
    }
    this_01 = local_90;
    uVar26 = this->m_num_blocks;
    uVar5 = endpoint_indices->m_size;
    if (uVar5 != uVar26) {
      if (uVar5 <= uVar26) {
        if (endpoint_indices->m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)endpoint_indices,uVar26,uVar5 + 1 == uVar26,8,
                     vector<crnlib::dxt_hc::endpoint_indices_details>::object_mover,false);
        }
        uVar5 = endpoint_indices->m_size;
        if (uVar26 != uVar5) {
          memset(endpoint_indices->m_p + uVar5,0,(ulong)(uVar26 - uVar5) << 3);
        }
      }
      endpoint_indices->m_size = uVar26;
    }
    uVar26 = this->m_num_blocks;
    uVar5 = this_01->m_size;
    if (uVar5 != uVar26) {
      if (uVar5 <= uVar26) {
        if (this_01->m_capacity < uVar26) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_01,uVar26,uVar5 + 1 == uVar26,6,
                     vector<crnlib::dxt_hc::selector_indices_details>::object_mover,false);
        }
        uVar5 = this_01->m_size;
        if (uVar26 != uVar5) {
          memset(this_01->m_p + uVar5,0,(((ulong)(uVar26 - uVar5) * 6 - 6) / 6) * 6 + 6);
        }
      }
      this_01->m_size = uVar26;
    }
    if (p->m_num_levels != 0) {
      local_a0 = p->m_levels;
      uVar27 = 0;
      do {
        local_48 = uVar27;
        uVar26 = local_a0[local_48].m_first_block;
        local_e0 = p->m_levels[local_48].m_num_blocks + uVar26;
        if (uVar26 < local_e0) {
          uVar5 = p->m_levels[local_48].m_block_width;
          local_38 = (ulong)-uVar5;
          local_40 = (ulong)~uVar5;
          iVar17 = 0;
          do {
            if (uVar5 != 0) {
              uVar20 = uVar26 - 1;
              uVar22 = -uVar5 + uVar26;
              uVar24 = ~uVar5 + uVar26;
              uVar13 = 0;
              do {
                bVar28 = uVar13 != 0 || iVar17 != 0;
                bVar30 = this->m_has_subblocks == true && (uVar13 != 0 && iVar17 != 0);
                local_98 = (ulong)uVar26;
                uVar27 = (ulong)this->m_has_color_blocks ^ 1;
                local_118 = (vector<unsigned_int> *)CONCAT44(local_118._4_4_,uVar22);
                bVar29 = iVar17 != 0;
                if ((uint)uVar27 < this->m_num_alpha_blocks + 1) {
                  do {
                    peVar21 = &local_128;
                    if (uVar27 == 0) {
                      peVar21 = &local_b8;
                    }
                    uVar3 = *(uint16 *)
                             ((long)peVar21->m_p +
                             (ulong)local_110->m_p[local_98].field_0.component[uVar27] * 2);
                    if (bVar28) {
                      bVar28 = uVar3 == endpoint_indices->m_p[uVar20].field_0.component[uVar27];
                    }
                    else {
                      bVar28 = false;
                    }
                    if (bVar29) {
                      bVar29 = uVar3 == endpoint_indices->m_p[uVar22].field_0.component[uVar27];
                    }
                    else {
                      bVar29 = false;
                    }
                    if (bVar30) {
                      bVar30 = uVar3 == endpoint_indices->m_p[uVar24].field_0.component[uVar27];
                    }
                    else {
                      bVar30 = false;
                    }
                    endpoint_indices->m_p[local_98].field_0.component[uVar27] = uVar3;
                    peVar21 = &local_148;
                    if (uVar27 == 0) {
                      peVar21 = &local_138;
                    }
                    local_90->m_p[local_98].field_0.component[uVar27] =
                         *(uint16 *)
                          ((long)peVar21->m_p +
                          (ulong)(this->m_selector_indices).m_p[local_98].field_0.component[uVar27]
                          * 2);
                    uVar27 = uVar27 + 1;
                  } while (uVar27 < this->m_num_alpha_blocks + 1);
                }
                if ((this->m_has_subblocks == true) && ((uVar26 & 1) != 0)) {
                  uVar12 = local_110->m_p[local_98].reference;
                }
                else {
                  uVar12 = '\x01';
                  if ((!bVar28) && (uVar12 = bVar30 * '\x03', bVar29)) {
                    uVar12 = '\x02';
                  }
                }
                endpoint_indices->m_p[local_98].reference = uVar12;
                uVar13 = uVar13 + 1;
                uVar26 = uVar26 + 1;
                uVar20 = uVar20 + 1;
                uVar22 = uVar22 + 1;
                uVar24 = uVar24 + 1;
              } while (uVar13 != uVar5);
            }
            iVar17 = iVar17 + 1;
          } while (uVar26 < local_e0);
        }
        uVar27 = local_48 + 1;
      } while (local_48 + 1 < (ulong)p->m_num_levels);
    }
    this->m_pTask_pool = (task_pool *)0x0;
    if (local_168._8_4_ != 0) {
      if ((hash_map_type *)local_168._0_8_ != (hash_map_type *)0x0) {
        crnlib_free((void *)local_168._0_8_);
        local_168._0_8_ = (hash_map_type *)0x0;
        local_168._8_4_ = 0;
        local_168._12_4_ = 0;
      }
      local_158 = 0x20;
      local_150._0_4_ = 0;
      local_150._4_4_ = 0;
    }
    if ((hash_map_type *)local_168._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_168._0_8_);
    }
    if (local_148.m_p != (void *)0x0) {
      crnlib_free(local_148.m_p);
    }
    if (local_108._8_4_ != 0) {
      if ((hash_map_type *)local_108._0_8_ != (hash_map_type *)0x0) {
        crnlib_free((void *)local_108._0_8_);
        local_108._0_8_ = (hash_map_type *)0x0;
        local_108._8_4_ = 0;
        local_108._12_4_ = 0;
      }
      local_f8 = 0x20;
      local_f0._0_4_ = 0;
      local_f0._4_4_ = 0;
    }
    if ((hash_map_type *)local_108._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_108._0_8_);
    }
    if (local_138.m_p != (void *)0x0) {
      crnlib_free(local_138.m_p);
    }
    if (local_d8._8_4_ != 0) {
      if ((hash_map_type *)local_d8._0_8_ != (hash_map_type *)0x0) {
        crnlib_free((void *)local_d8._0_8_);
        local_d8._0_8_ = (hash_map_type *)0x0;
        local_d8._8_4_ = 0;
        local_d8._12_4_ = 0;
      }
      local_c8 = 0x20;
      local_c0._0_4_ = 0;
      local_c0._4_4_ = 0;
    }
    if ((hash_map_type *)local_d8._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_d8._0_8_);
    }
    if (local_128.m_p != (void *)0x0) {
      crnlib_free(local_128.m_p);
    }
    if (local_88.m_values.m_size != 0) {
      if (local_88.m_values.m_p != (raw_node *)0x0) {
        crnlib_free(local_88.m_values.m_p);
        local_88.m_values.m_p = (raw_node *)0x0;
        local_88.m_values.m_size = 0;
        local_88.m_values.m_capacity = 0;
      }
      local_88.m_hash_shift = 0x20;
      local_88.m_num_valid = 0;
      local_88.m_grow_threshold = 0;
    }
    if (local_88.m_values.m_p != (raw_node *)0x0) {
      crnlib_free(local_88.m_values.m_p);
    }
    if (local_b8.m_p != (void *)0x0) {
      crnlib_free(local_b8.m_p);
    }
  }
  return bVar19;
}

Assistant:

bool dxt_hc::compress(
        color_quad_u8 (*blocks)[16],
        crnlib::vector<endpoint_indices_details>& endpoint_indices,
        crnlib::vector<selector_indices_details>& selector_indices,
        crnlib::vector<uint32>& color_endpoints,
        crnlib::vector<uint32>& alpha_endpoints,
        crnlib::vector<uint32>& color_selectors,
        crnlib::vector<uint64>& alpha_selectors,
        const params& p)
    {
        clear();
        m_has_etc_color_blocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A || p.m_format == cETC1S || p.m_format == cETC2AS;
        m_has_subblocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A;
        m_has_color_blocks = p.m_format == cDXT1 || p.m_format == cDXT5 || m_has_etc_color_blocks;
        m_num_alpha_blocks = p.m_format == cDXT5 || p.m_format == cDXT5A || p.m_format == cETC2A || p.m_format == cETC2AS ? 1 : p.m_format == cDXN_XY || p.m_format == cDXN_YX ? 2
                                                                                                                                                                               : 0;
        if (!m_has_color_blocks && !m_num_alpha_blocks)
        {
            return false;
        }
        m_blocks = blocks;
        m_main_thread_id = crn_get_current_thread_id();
        m_pTask_pool = p.m_pTask_pool;
        m_params = p;

        uint tile_derating[8] = { 0, 1, 1, 2, 2, 2, 2, 3 };
        for (uint level = 0; level < p.m_num_levels; level++)
        {
            float adaptive_tile_color_psnr_derating = p.m_adaptive_tile_color_psnr_derating;
            if (level && adaptive_tile_color_psnr_derating > .25f)
            {
                adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.0f, static_cast<float>(level)));
            }
            for (uint e = 0; e < 8; e++)
            {
                m_color_derating[level][e] = math::lerp(0.0f, adaptive_tile_color_psnr_derating, tile_derating[e] / 3.0f);
            }
        }
        for (uint e = 0; e < 8; e++)
        {
            m_alpha_derating[e] = math::lerp(0.0f, m_params.m_adaptive_tile_alpha_psnr_derating, tile_derating[e] / 3.0f);
        }
        for (uint i = 0; i < 256; i++)
        {
            m_uint8_to_float[i] = i * 1.0f / 255.0f;
        }

        m_num_blocks = m_params.m_num_blocks;
        m_block_weights.resize(m_num_blocks);
        m_block_encodings.resize(m_num_blocks);
        for (uint c = 0; c < 3; c++)
        {
            m_block_selectors[c].resize(m_num_blocks);
        }
        m_tile_indices.resize(m_num_blocks);
        m_endpoint_indices.resize(m_num_blocks);
        m_selector_indices.resize(m_num_blocks);
        m_tiles.resize(m_num_blocks);

        for (uint level = 0; level < p.m_num_levels; level++)
        {
            float weight = p.m_levels[level].m_weight;
            for (uint b = p.m_levels[level].m_first_block, bEnd = b + p.m_levels[level].m_num_blocks; b < bEnd; b++)
            {
                m_block_weights[b] = weight;
            }
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, m_has_subblocks ? &dxt_hc::determine_tiles_task_etc : &dxt_hc::determine_tiles_task, i);
        }
        m_pTask_pool->join();

        m_num_tiles = 0;
        for (uint t = 0; t < m_tiles.size(); t++)
        {
            if (m_tiles[t].pixels.size())
            {
                m_num_tiles++;
            }
        }

        if (m_has_color_blocks)
        {
            determine_color_endpoints();
        }

        if (m_num_alpha_blocks)
        {
            determine_alpha_endpoints();
        }

        if (m_has_color_blocks)
        {
            create_color_selector_codebook();
        }

        if (m_num_alpha_blocks)
        {
            create_alpha_selector_codebook();
        }

        color_endpoints.reserve(color_endpoints.size() + m_color_clusters.size());
        crnlib::vector<uint16> color_endpoints_remap(m_color_clusters.size());
        hash_map<uint32, uint> color_endpoints_map;
        for (uint i = 0; i < m_color_clusters.size(); i++)
        {
            if (m_color_clusters[i].pixels.size())
            {
                uint32 endpoint = m_has_etc_color_blocks ? m_color_clusters[i].first_endpoint : dxt1_block::pack_endpoints(m_color_clusters[i].first_endpoint, m_color_clusters[i].second_endpoint);
                hash_map<uint32, uint>::insert_result insert_result = color_endpoints_map.insert(endpoint, color_endpoints.size());
                if (insert_result.second)
                {
                    color_endpoints_remap[i] = color_endpoints.size();
                    color_endpoints.push_back(endpoint);
                }
                else
                {
                    color_endpoints_remap[i] = insert_result.first->second;
                }
            }
        }

        alpha_endpoints.reserve(alpha_endpoints.size() + m_alpha_clusters.size());
        crnlib::vector<uint16> alpha_endpoints_remap(m_alpha_clusters.size());
        hash_map<uint32, uint> alpha_endpoints_map;
        for (uint i = 0; i < m_alpha_clusters.size(); i++)
        {
            if (m_alpha_clusters[i].pixels.size())
            {
                uint32 endpoint = dxt5_block::pack_endpoints(m_alpha_clusters[i].first_endpoint, m_alpha_clusters[i].second_endpoint);
                hash_map<uint32, uint>::insert_result insert_result = alpha_endpoints_map.insert(endpoint, alpha_endpoints.size());
                if (insert_result.second)
                {
                    alpha_endpoints_remap[i] = alpha_endpoints.size();
                    alpha_endpoints.push_back(endpoint);
                }
                else
                {
                    alpha_endpoints_remap[i] = insert_result.first->second;
                }
            }
        }

        color_selectors.reserve(color_selectors.size() + m_color_selectors.size());
        crnlib::vector<uint16> color_selectors_remap(m_color_selectors.size());
        hash_map<uint32, uint> color_selectors_map;
        for (uint i = 0; i < m_color_selectors.size(); i++)
        {
            if (m_color_selectors_used[i])
            {
                hash_map<uint32, uint>::insert_result insert_result = color_selectors_map.insert(m_color_selectors[i], color_selectors.size());
                if (insert_result.second)
                {
                    color_selectors_remap[i] = color_selectors.size();
                    color_selectors.push_back(m_color_selectors[i]);
                }
                else
                {
                    color_selectors_remap[i] = insert_result.first->second;
                }
            }
        }

        alpha_selectors.reserve(alpha_selectors.size() + m_alpha_selectors.size());
        crnlib::vector<uint16> alpha_selectors_remap(m_alpha_selectors.size());
        hash_map<uint64, uint> alpha_selectors_map;
        for (uint i = 0; i < m_alpha_selectors.size(); i++)
        {
            if (m_alpha_selectors_used[i])
            {
                hash_map<uint64, uint>::insert_result insert_result = alpha_selectors_map.insert(m_alpha_selectors[i], alpha_selectors.size());
                if (insert_result.second)
                {
                    alpha_selectors_remap[i] = alpha_selectors.size();
                    alpha_selectors.push_back(m_alpha_selectors[i]);
                }
                else
                {
                    alpha_selectors_remap[i] = insert_result.first->second;
                }
            }
        }

        endpoint_indices.resize(m_num_blocks);
        selector_indices.resize(m_num_blocks);
        for (uint level = 0; level < p.m_num_levels; level++)
        {
            uint first_block = p.m_levels[level].m_first_block;
            uint end_block = first_block + p.m_levels[level].m_num_blocks;
            uint block_width = p.m_levels[level].m_block_width;
            for (uint by = 0, b = first_block; b < end_block; by++)
            {
                for (uint bx = 0; bx < block_width; bx++, b++)
                {
                    bool top_match = by != 0;
                    bool left_match = top_match || bx;
                    bool diag_match = m_has_subblocks && top_match && bx;
                    for (uint c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++)
                    {
                        uint16 endpoint_index = (c ? alpha_endpoints_remap : color_endpoints_remap)[m_endpoint_indices[b].component[c]];
                        left_match = left_match && endpoint_index == endpoint_indices[b - 1].component[c];
                        top_match = top_match && endpoint_index == endpoint_indices[b - block_width].component[c];
                        diag_match = diag_match && endpoint_index == endpoint_indices[b - block_width - 1].component[c];
                        endpoint_indices[b].component[c] = endpoint_index;
                        uint16 selector_index = (c ? alpha_selectors_remap : color_selectors_remap)[m_selector_indices[b].component[c]];
                        selector_indices[b].component[c] = selector_index;
                    }
                    endpoint_indices[b].reference = m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : left_match ? 1
                        : top_match                                                                                         ? 2
                        : diag_match                                                                                        ? 3
                                                                                                                            : 0;
                }
            }
        }

        m_pTask_pool = nullptr;
        return true;
    }